

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall
testing::internal::StreamingListener::OnTestCaseEnd(StreamingListener *this,TestCase *test_case)

{
  int iVar1;
  void *local_68 [2];
  void *local_58;
  long local_50;
  string local_48;
  TimeInMillis local_28;
  
  iVar1 = TestCase::failed_test_count(test_case);
  local_28 = test_case->elapsed_time_;
  StreamableToString<long_long>((internal *)local_68,&local_28);
  String::Format((char *)&local_58,"event=TestCaseEnd&passed=%d&elapsed_time=%sms\n",
                 (ulong)(iVar1 < 1),local_68[0]);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,local_58,local_50 + (long)local_58);
  Send(this,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (local_58 != (void *)0x0) {
    operator_delete__(local_58);
  }
  if (local_68[0] != (void *)0x0) {
    operator_delete__(local_68[0]);
  }
  return;
}

Assistant:

void OnTestCaseEnd(const TestCase& test_case) {
    Send(String::Format("event=TestCaseEnd&passed=%d&elapsed_time=%sms\n",
                        test_case.Passed(),
                        StreamableToString(test_case.elapsed_time()).c_str()));
  }